

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_logging.cpp
# Opt level: O0

void __thiscall cubeb_logging_Test::TestBody(cubeb_logging_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t iterations;
  bool log_callback_set;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> cleanup_stream_at_exit;
  AssertionResult gtest_ar_1;
  unique_ptr<cubeb,_void_(*)(cubeb_*)> cleanup_cubeb_at_exit;
  AssertionResult gtest_ar;
  uint32_t latency_frames;
  int r;
  cubeb_stream_params output_params;
  cubeb_stream *stream;
  cubeb *ctx;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_6;
  memory_order __b_1;
  pointer in_stack_fffffffffffffcc8;
  cubeb_stream *__p;
  cubeb_log_level in_stack_fffffffffffffcd0;
  cubeb_log_level log_level;
  undefined4 in_stack_fffffffffffffcd4;
  int *in_stack_fffffffffffffcd8;
  code *val1;
  cubeb **in_stack_fffffffffffffce0;
  code *rhs_expression;
  char *in_stack_fffffffffffffce8;
  int line;
  char *lhs_expression;
  atomic<unsigned_int> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  Type in_stack_fffffffffffffcfc;
  atomic<unsigned_int> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  cubeb_stream_params *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  char *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  cubeb *in_stack_fffffffffffffd30;
  atomic<unsigned_int> *paVar2;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 uVar3;
  AssertHelper *in_stack_fffffffffffffd50;
  cubeb_stream_params *in_stack_fffffffffffffd60;
  atomic<unsigned_int> *paVar4;
  uint in_stack_fffffffffffffd68;
  cubeb_data_callback in_stack_fffffffffffffd70;
  Message *in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  AssertionResult local_268 [2];
  undefined4 local_248;
  __int_type local_244;
  AssertionResult local_240 [2];
  undefined4 local_220;
  __int_type local_21c;
  AssertionResult local_218;
  int local_208;
  byte local_201;
  undefined4 local_1f0;
  __int_type local_1ec;
  AssertionResult local_1e8 [2];
  undefined4 local_1c8;
  __atomic_base<unsigned_int> local_1c4;
  AssertionResult local_1c0 [2];
  undefined4 local_1a0;
  __int_type local_19c;
  AssertionResult local_198;
  code *local_188;
  undefined4 local_15c;
  AssertionResult local_158;
  code *local_148;
  uint local_12c;
  undefined4 local_114;
  AssertionResult local_110;
  cubeb_log_level local_fc;
  int local_f8;
  cubeb_stream local_f4;
  undefined4 local_e4;
  __int_type local_c4;
  memory_order local_c0;
  Type local_bc;
  atomic<unsigned_int> *local_b8;
  __int_type local_ac;
  memory_order local_a8;
  int local_a4;
  atomic<unsigned_int> *local_a0;
  __int_type local_94;
  memory_order local_90;
  int local_8c;
  atomic<unsigned_int> *local_88;
  __int_type local_7c;
  memory_order local_78;
  int local_74;
  atomic<unsigned_int> *local_70;
  __atomic_base<unsigned_int> local_64;
  memory_order local_60;
  undefined4 local_5c;
  atomic<unsigned_int> *local_58;
  __int_type local_4c;
  memory_order local_48;
  int local_44;
  atomic<unsigned_int> *local_40;
  cubeb_sample_format local_38;
  memory_order local_34;
  int local_30;
  cubeb_sample_format local_2c;
  atomic<unsigned_int> *local_28;
  __int_type local_20;
  memory_order local_1c;
  int local_18;
  __int_type local_14;
  atomic<unsigned_int> *local_10;
  
  local_fc = CUBEB_LOG_DISABLED;
  cubeb_set_log_callback(in_stack_fffffffffffffcd0,(cubeb_log_callback)in_stack_fffffffffffffcc8);
  local_f8 = common_init(in_stack_fffffffffffffce0,(char *)in_stack_fffffffffffffcd8);
  local_114 = 0;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            (in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  line = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd78 =
         testing::Message::operator<<
                   ((Message *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                    (char (*) [33])in_stack_fffffffffffffcc8);
    testing::AssertionResult::failure_message((AssertionResult *)0x10bcdb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0,line,(char *)in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,
               (Message *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    testing::Message::~Message((Message *)0x10bd2b);
  }
  local_12c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd50);
  if (local_12c == 0) {
    local_148 = cubeb_destroy;
    std::unique_ptr<cubeb,void(*)(cubeb*)>::unique_ptr<void(*)(cubeb*),void>
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcc8,
               (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_*)>::value,_void_(*&&)(cubeb_*)>)
               0x10bd8e);
    local_f4.context._0_4_ = 2;
    local_f4.context._4_4_ = 48000;
    local_f4.user_ptr._0_4_ = 2;
    local_f4.user_ptr._4_4_ = 3;
    local_e4 = 0;
    local_f8 = cubeb_get_min_latency
                         ((cubeb *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                          (cubeb_stream_params *)in_stack_fffffffffffffd00,
                          (uint32_t *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
    ;
    if (local_f8 != 0) {
      local_fc = 0x400;
    }
    __p = &local_f4;
    val1 = data_cb_load;
    rhs_expression = state_cb;
    lhs_expression = (char *)0x0;
    log_level = local_fc;
    local_f8 = cubeb_stream_init(in_stack_fffffffffffffd30,
                                 (cubeb_stream **)
                                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                 in_stack_fffffffffffffd20,
                                 (cubeb_devid)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                 in_stack_fffffffffffffd10,
                                 (cubeb_devid)
                                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                 in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
                                 in_stack_fffffffffffffd70,
                                 (cubeb_state_callback)in_stack_fffffffffffffd78,
                                 in_stack_fffffffffffffd80);
    local_15c = 0;
    testing::internal::EqHelper::
    Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
              (lhs_expression,(char *)rhs_expression,(int *)val1,
               (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd00);
      testing::Message::operator<<
                ((Message *)CONCAT44(in_stack_fffffffffffffcd4,log_level),(char (*) [32])__p);
      testing::AssertionResult::failure_message((AssertionResult *)0x10beea);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                 (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                 (char *)rhs_expression);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd50,
                 (Message *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
      testing::Message::~Message((Message *)0x10bf3a);
    }
    local_12c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf5f);
    if (local_12c == 0) {
      local_188 = cubeb_stream_destroy;
      std::unique_ptr<cubeb_stream,void(*)(cubeb_stream*)>::unique_ptr<void(*)(cubeb_stream*),void>
                ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                 CONCAT44(in_stack_fffffffffffffcd4,log_level),__p,
                 (__enable_if_t<_is_lvalue_reference<void_(*)(cubeb_stream_*)>::value,_void_(*&&)(cubeb_stream_*)>
                  )0x10bf9c);
      local_40 = &log_statements_received;
      local_44 = 2;
      paVar4 = &log_statements_received;
      local_48 = std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_44 - 1U < 2) {
        local_4c = (paVar4->super___atomic_base<unsigned_int>)._M_i;
      }
      else if (local_44 == 5) {
        local_4c = (paVar4->super___atomic_base<unsigned_int>)._M_i;
      }
      else {
        local_4c = (paVar4->super___atomic_base<unsigned_int>)._M_i;
      }
      local_19c = local_4c;
      local_1a0 = 0;
      testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                (lhs_expression,(char *)rhs_expression,(uint *)val1,
                 (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd00);
        testing::AssertionResult::failure_message((AssertionResult *)0x10c0ad);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                   (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                   (char *)rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd50,
                   (Message *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
        testing::Message::~Message((Message *)0x10c0fd);
      }
      local_12c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c122);
      if (local_12c == 0) {
        cubeb_set_log_callback(log_level,(cubeb_log_callback)__p);
        local_10 = &log_statements_received;
        local_14 = 0;
        local_18 = 3;
        paVar4 = &log_statements_received;
        local_1c = std::operator&(memory_order_release,__memory_order_mask);
        local_20 = local_14;
        if (local_18 == 3) {
          ((__atomic_base<unsigned_int> *)&((AssertHelper *)paVar4)->data_)->_M_i = local_14;
        }
        else if (local_18 == 5) {
          LOCK();
          ((__atomic_base<unsigned_int> *)&((AssertHelper *)paVar4)->data_)->_M_i = local_14;
          UNLOCK();
        }
        else {
          ((__atomic_base<unsigned_int> *)&((AssertHelper *)paVar4)->data_)->_M_i = local_14;
        }
        cubeb_stream_start(__p);
        local_58 = &log_statements_received;
        local_5c = 2;
        local_60 = std::operator&(memory_order_acquire,__memory_order_mask);
        local_64 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
        local_1c4 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
        local_1c8 = 0;
        uVar3 = local_5c;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (lhs_expression,(char *)rhs_expression,(uint *)val1,
                   (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd00);
          testing::AssertionResult::failure_message((AssertionResult *)0x10c303);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                     (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                     (char *)rhs_expression);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)paVar4,(Message *)CONCAT44(uVar3,in_stack_fffffffffffffd48));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
          testing::Message::~Message((Message *)0x10c353);
        }
        local_12c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c378);
        if (local_12c == 0) {
          cubeb_set_log_callback(log_level,(cubeb_log_callback)__p);
          wait_for_audio_callback();
          local_70 = &log_statements_received;
          local_74 = 2;
          paVar2 = &log_statements_received;
          local_78 = std::operator&(memory_order_acquire,__memory_order_mask);
          if (local_74 - 1U < 2) {
            local_7c = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          }
          else if (local_74 == 5) {
            local_7c = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          }
          else {
            local_7c = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          }
          local_1ec = local_7c;
          local_1f0 = 0;
          testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                    (lhs_expression,(char *)rhs_expression,(uint *)val1,
                     (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffd00);
            testing::AssertionResult::failure_message((AssertionResult *)0x10c49e);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                       (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                       (char *)rhs_expression);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)paVar4,(Message *)CONCAT44(uVar3,in_stack_fffffffffffffd48));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
            testing::Message::~Message((Message *)0x10c4ee);
          }
          local_12c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c513);
          if (local_12c == 0) {
            local_201 = 1;
            local_208 = 100;
            while (local_208 != 0) {
              local_208 = local_208 + -1;
              wait_for_audio_callback();
              if ((local_201 & 1) == 0) {
                local_88 = &log_statements_received;
                local_8c = 2;
                paVar2 = &log_statements_received;
                local_90 = std::operator&(memory_order_acquire,__memory_order_mask);
                if (local_8c - 1U < 2) {
                  local_94 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                else if (local_8c == 5) {
                  local_94 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                else {
                  local_94 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                local_21c = local_94;
                local_220 = 0;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          (lhs_expression,(char *)rhs_expression,(uint *)val1,
                           (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffd00);
                  testing::AssertionResult::failure_message((AssertionResult *)0x10c665);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                             (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                             (char *)rhs_expression);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)paVar4,
                             (Message *)CONCAT44(uVar3,in_stack_fffffffffffffd48));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                  testing::Message::~Message((Message *)0x10c6b5);
                }
                local_12c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c6da);
                if (local_12c != 0) goto LAB_0010cae0;
                cubeb_set_log_callback(log_level,(cubeb_log_callback)__p);
                local_201 = 1;
              }
              else {
                local_a0 = &log_statements_received;
                local_a4 = 2;
                paVar2 = &log_statements_received;
                local_a8 = std::operator&(memory_order_acquire,__memory_order_mask);
                if (local_a4 - 1U < 2) {
                  local_ac = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                else if (local_a4 == 5) {
                  local_ac = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                else {
                  local_ac = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                }
                local_244 = local_ac;
                local_248 = 0;
                testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                          (lhs_expression,(char *)rhs_expression,(uint *)val1,
                           (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffd00);
                  testing::AssertionResult::failure_message((AssertionResult *)0x10c808);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                             (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                             (char *)rhs_expression);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)paVar4,
                             (Message *)CONCAT44(uVar3,in_stack_fffffffffffffd48));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                  testing::Message::~Message((Message *)0x10c858);
                }
                local_12c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c87d);
                if (local_12c != 0) goto LAB_0010cae0;
                cubeb_set_log_callback(log_level,(cubeb_log_callback)__p);
                local_28 = &log_statements_received;
                local_2c = CUBEB_SAMPLE_S16LE;
                local_30 = 3;
                in_stack_fffffffffffffd00 = &log_statements_received;
                local_34 = std::operator&(memory_order_release,__memory_order_mask);
                local_38 = local_2c;
                if (local_30 == 3) {
                  ((cubeb_stream_params *)in_stack_fffffffffffffd00)->format = local_2c;
                }
                else if (local_30 == 5) {
                  LOCK();
                  ((cubeb_stream_params *)in_stack_fffffffffffffd00)->format = local_2c;
                  UNLOCK();
                }
                else {
                  ((cubeb_stream_params *)in_stack_fffffffffffffd00)->format = local_2c;
                }
                local_b8 = &log_statements_received;
                local_bc = kFatalFailure;
                in_stack_fffffffffffffcf0 = &log_statements_received;
                local_c0 = std::operator&(memory_order_acquire,__memory_order_mask);
                if (local_bc - kNonFatalFailure < 2) {
                  local_c4 = (in_stack_fffffffffffffcf0->super___atomic_base<unsigned_int>)._M_i;
                }
                else if (local_bc == 5) {
                  local_c4 = (in_stack_fffffffffffffcf0->super___atomic_base<unsigned_int>)._M_i;
                }
                else {
                  local_c4 = (in_stack_fffffffffffffcf0->super___atomic_base<unsigned_int>)._M_i;
                }
                in_stack_fffffffffffffcfc = local_bc;
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                          (lhs_expression,(char *)rhs_expression,(uint *)val1,
                           (uint *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffd00);
                  testing::AssertionResult::failure_message((AssertionResult *)0x10ca39);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                             (char *)in_stack_fffffffffffffcf0,(int)((ulong)lhs_expression >> 0x20),
                             (char *)rhs_expression);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)paVar4,
                             (Message *)CONCAT44(uVar3,in_stack_fffffffffffffd48));
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffcd4,log_level));
                  testing::Message::~Message((Message *)0x10ca89);
                }
                local_12c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10caae);
                if (local_12c != 0) goto LAB_0010cae0;
                local_201 = 0;
              }
            }
            local_208 = local_208 + -1;
            cubeb_stream_stop(__p);
            local_12c = 0;
          }
        }
      }
LAB_0010cae0:
      std::unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)>::~unique_ptr
                ((unique_ptr<cubeb_stream,_void_(*)(cubeb_stream_*)> *)
                 CONCAT44(in_stack_fffffffffffffcd4,log_level));
    }
    std::unique_ptr<cubeb,_void_(*)(cubeb_*)>::~unique_ptr
              ((unique_ptr<cubeb,_void_(*)(cubeb_*)> *)CONCAT44(in_stack_fffffffffffffcd4,log_level)
              );
  }
  return;
}

Assistant:

TEST(cubeb, logging)
{
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params output_params;
  int r;
  uint32_t latency_frames = 0;

  cubeb_set_log_callback(CUBEB_LOG_NORMAL, test_logging_callback);

  r = common_init(&ctx, "Cubeb logging test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)> cleanup_cubeb_at_exit(
      ctx, cubeb_destroy);

  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 48000;
  output_params.channels = 2;
  output_params.layout = CUBEB_LAYOUT_STEREO;
  output_params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &output_params, &latency_frames);
  if (r != CUBEB_OK) {
    // not fatal
    latency_frames = 1024;
  }

  r = cubeb_stream_init(ctx, &stream, "Cubeb logging", NULL, NULL, NULL,
                        &output_params, latency_frames, data_cb_load, state_cb,
                        NULL);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
      cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);

  cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr);
  log_statements_received.store(0, std::memory_order_release);

  // This is synchronous and we'll receive log messages on all backends that we
  // test
  cubeb_stream_start(stream);

  ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);

  cubeb_set_log_callback(CUBEB_LOG_VERBOSE, test_logging_callback);

  wait_for_audio_callback();

  ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);

  bool log_callback_set = true;
  uint32_t iterations = 100;
  while (iterations--) {
    wait_for_audio_callback();

    if (!log_callback_set) {
      ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);
      // Set a logging callback, start logging
      cubeb_set_log_callback(CUBEB_LOG_VERBOSE, test_logging_callback);
      log_callback_set = true;
    } else {
      // Disable the logging callback, stop logging.
      ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);
      cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr);
      log_statements_received.store(0, std::memory_order_release);
      // Disabling logging should flush any log message -- wait a bit and check
      // that this is true.
      ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);
      log_callback_set = false;
    }
  }

  cubeb_stream_stop(stream);
}